

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_composites.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateCompositeExtract(ValidationState_t *_,Instruction *inst)

{
  Instruction *this;
  bool bVar1;
  Op OVar2;
  uint32_t id;
  DiagnosticStream *pDVar3;
  DiagnosticStream local_3f0;
  char *local_218;
  char *local_210;
  DiagnosticStream local_208;
  uint32_t local_2c;
  spv_result_t local_28;
  uint32_t result_type;
  spv_result_t error;
  uint32_t member_type;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  result_type = 0;
  _error = inst;
  inst_local = (Instruction *)_;
  local_28 = GetExtractInsertValueType(_,inst,&result_type);
  __local._4_4_ = local_28;
  if (local_28 == SPV_SUCCESS) {
    local_2c = Instruction::type_id(_error);
    if (local_2c == result_type) {
      bVar1 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,CapabilityShader);
      this = inst_local;
      if (bVar1) {
        id = Instruction::type_id(_error);
        bVar1 = ValidationState_t::ContainsLimitedUseIntOrFloatType((ValidationState_t *)this,id);
        if (bVar1) {
          ValidationState_t::diag
                    (&local_3f0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_error);
          pDVar3 = DiagnosticStream::operator<<
                             (&local_3f0,
                              (char (*) [54])"Cannot extract from a composite of 8- or 16-bit types"
                             );
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
          DiagnosticStream::~DiagnosticStream(&local_3f0);
          return __local._4_4_;
        }
      }
      __local._4_4_ = SPV_SUCCESS;
    }
    else {
      ValidationState_t::diag
                (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_error);
      pDVar3 = DiagnosticStream::operator<<(&local_208,(char (*) [16])"Result type (Op");
      OVar2 = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,local_2c);
      local_210 = spvOpcodeString(OVar2);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_210);
      pDVar3 = DiagnosticStream::operator<<
                         (pDVar3,(char (*) [76])
                                 ") does not match the type that results from indexing into the composite (Op"
                         );
      OVar2 = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,result_type);
      local_218 = spvOpcodeString(OVar2);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_218);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [3])0x68219d);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream(&local_208);
    }
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateCompositeExtract(ValidationState_t& _,
                                      const Instruction* inst) {
  uint32_t member_type = 0;
  if (spv_result_t error = GetExtractInsertValueType(_, inst, &member_type)) {
    return error;
  }

  const uint32_t result_type = inst->type_id();
  if (result_type != member_type) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Result type (Op" << spvOpcodeString(_.GetIdOpcode(result_type))
           << ") does not match the type that results from indexing into "
              "the composite (Op"
           << spvOpcodeString(_.GetIdOpcode(member_type)) << ").";
  }

  if (_.HasCapability(spv::Capability::Shader) &&
      _.ContainsLimitedUseIntOrFloatType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Cannot extract from a composite of 8- or 16-bit types";
  }

  return SPV_SUCCESS;
}